

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

tuple<double,_long>
findBestCC<short>(TWaveformViewT<short> *waveform0,TWaveformViewT<short> *waveform1,
                 int64_t alignWindow)

{
  long lVar1;
  int64_t iVar2;
  short *psVar3;
  long in_RCX;
  long lVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  bool bVar8;
  _Head_base<0UL,_double,_false> _Var9;
  _Head_base<0UL,_double,_false> _Var10;
  tuple<double,_long> tVar11;
  TWaveformViewT<short> local_50;
  tuple<long,_long> ret;
  
  iVar2 = waveform1->n;
  psVar5 = *(short **)alignWindow;
  calcSum<short>((TWaveformViewT<short> *)&ret);
  lVar1 = in_RCX * 2 + 1;
  lVar4 = 0;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  psVar6 = (short *)-in_RCX;
  psVar7 = (short *)0xffffffffffffffff;
  _Var9._M_head_impl = -1.0;
  while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
    local_50.samples = psVar5;
    local_50.n = iVar2;
    _Var10._M_head_impl =
         calcCC<short>(waveform1,&local_50,
                       ret.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>.
                       _M_head_impl,
                       (int64_t)ret.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
                                super__Head_base<1UL,_long,_false>._M_head_impl);
    psVar3 = psVar6;
    if (_Var10._M_head_impl <= _Var9._M_head_impl) {
      _Var10._M_head_impl = _Var9._M_head_impl;
      psVar3 = psVar7;
    }
    psVar7 = psVar3;
    psVar5 = psVar5 + 1;
    psVar6 = (short *)((long)psVar6 + 1);
    _Var9._M_head_impl = _Var10._M_head_impl;
  }
  waveform0->samples = psVar7;
  waveform0->n = (int64_t)_Var9._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var9._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform0;
  return (tuple<double,_long>)tVar11.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TWaveformViewT<T> & waveform0,
    const TWaveformViewT<T> & waveform1,
    int64_t alignWindow) {
    TValueCC bestcc = -1.0;
    TOffset besto = -1;

    //auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;

#ifdef MY_DEBUG
    auto n1 = waveform1.n;
    if (n0 + 2*alignWindow != n1) {
        printf("BUG 924830jm92, n0 = %d, a = %d\n", (int) n0, (int) alignWindow);
    }
#endif

    auto ret = calcSum(waveform0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

    for (int o = 0; o <= 2*alignWindow; ++o) {
        auto cc = calcCC(waveform0, { samples1 + o, n0 }, sum0, sum02);
        if (cc > bestcc) {
            besto = o - alignWindow;
            bestcc = cc;
        }
    }

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}